

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DGXMLScanner::commonInit(DGXMLScanner *this)

{
  uint uVar1;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_00;
  DTDValidator *this_01;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_02;
  RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this_03;
  Hash2KeysSetOf<xercesc_4_0::StringHasher> *this_04;
  RuntimeException *this_05;
  DGXMLScanner *this_local;
  
  this_00 = (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)
            XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  ValueVectorOf<xercesc_4_0::XMLAttr_*>::ValueVectorOf
            (this_00,8,(this->super_XMLScanner).fMemoryManager,false);
  this->fAttrNSList = this_00;
  this_01 = (DTDValidator *)XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  DTDValidator::DTDValidator(this_01,(XMLErrorReporter *)0x0);
  this->fDTDValidator = this_01;
  XMLScanner::initValidator(&this->super_XMLScanner,&this->fDTDValidator->super_XMLValidator);
  this_02 = (NameIdPool<xercesc_4_0::DTDElementDecl> *)
            XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
  NameIdPool<xercesc_4_0::DTDElementDecl>::NameIdPool
            (this_02,0x1d,0x80,(this->super_XMLScanner).fMemoryManager);
  this->fDTDElemNonDeclPool = this_02;
  this_03 = (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)
            XMemory::operator_new(0x38,(this->super_XMLScanner).fMemoryManager);
  RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::RefHashTableOf
            (this_03,0x83,false,(this->super_XMLScanner).fMemoryManager);
  this->fAttDefRegistry = this_03;
  this_04 = (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  Hash2KeysSetOf<xercesc_4_0::StringHasher>::Hash2KeysSetOf
            (this_04,7,(this->super_XMLScanner).fMemoryManager);
  this->fUndeclaredAttrRegistry = this_04;
  if ((this->super_XMLScanner).fValidator == (XMLValidator *)0x0) {
    (this->super_XMLScanner).fValidator = &this->fDTDValidator->super_XMLValidator;
  }
  else {
    uVar1 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xc])();
    if ((uVar1 & 1) == 0) {
      this_05 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_05,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0x8a0,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_05,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
  }
  return;
}

Assistant:

void DGXMLScanner::commonInit()
{
    //  And we need one for the raw attribute scan. This just stores key/
    //  value string pairs (prior to any processing.)
    fAttrNSList = new (fMemoryManager) ValueVectorOf<XMLAttr*>(8, fMemoryManager);

    //  Create the Validator and init them
    fDTDValidator = new (fMemoryManager) DTDValidator();
    initValidator(fDTDValidator);
    fDTDElemNonDeclPool = new (fMemoryManager) NameIdPool<DTDElementDecl>(29, 128, fMemoryManager);
    fAttDefRegistry = new (fMemoryManager) RefHashTableOf<unsigned int, PtrHasher>
    (
        131, false, fMemoryManager
    );
    fUndeclaredAttrRegistry = new (fMemoryManager) Hash2KeysSetOf<StringHasher>(7, fMemoryManager);

    if (fValidator)
    {
        if (!fValidator->handlesDTD())
           ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
    }
    else
    {
        fValidator = fDTDValidator;
    }
}